

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImPool<ImGuiTable>::~ImPool(ImPool<ImGuiTable> *this)

{
  Clear(this);
  ImVector<ImGuiStorage::ImGuiStoragePair>::~ImVector(&(this->Map).Data);
  ImVector<ImGuiTable>::~ImVector(&this->Buf);
  return;
}

Assistant:

~ImPool()   { Clear(); }